

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.c
# Opt level: O0

INT16 MemoryCopy2B(TPM2B *dest,TPM2B *source,uint dSize)

{
  UINT16 local_1e;
  INT16 result;
  uint dSize_local;
  TPM2B *source_local;
  TPM2B *dest_local;
  
  if (dest == (TPM2B *)0x0) {
    local_1e = 0;
  }
  else {
    if (source == (TPM2B *)0x0) {
      dest->size = 0;
    }
    else if (dSize < source->size) {
      dest->size = 0;
    }
    else {
      MemoryCopy(dest->buffer,source->buffer,(uint)source->size);
      dest->size = source->size;
    }
    local_1e = dest->size;
  }
  return local_1e;
}

Assistant:

INT16 MemoryCopy2B(TPM2B* dest, const TPM2B* source, unsigned int dSize)
{
    INT16 result;
    if (dest == NULL)
    {
        result = 0;
    }
    else
    {
        if (source == NULL)
        {
            dest->size = 0;
        }
        else if (source->size > dSize)
        {
            dest->size = 0;
        }
        else
        {
            //pAssert(source->size <= dSize);
            MemoryCopy(dest->buffer, source->buffer, source->size);
            dest->size = source->size;
        }
        result = dest->size;
    }
    return result;
}